

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O1

CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,Scalar *s)

{
  Scalar SVar1;
  long lVar2;
  
  if (this->m_col == 1) {
    lVar2 = this->m_row + this->m_currentBlockRows;
    this->m_row = lVar2;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if ((this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
        m_rows <= lVar2) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x42,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
  }
  lVar2 = this->m_col;
  if (lVar2 < 1) {
    if (this->m_currentBlockRows == 1) {
      SVar1 = *s;
      this->m_col = lVar2 + 1;
      (this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [lVar2 * (this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_rows + this->m_row] = SVar1;
      return this;
    }
    __assert_fail("m_currentBlockRows==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x46,
                  "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ksakmann[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                ,0x45,
                "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }